

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O3

StellaOutputProxy __thiscall
stella::detail::StellaOutput::operator<<(StellaOutput *this,char (*obj) [17])

{
  char (*in_RDX) [17];
  int iVar1;
  
  if (*(int *)(*obj + 0xc) < *(int *)(*obj + 8)) {
    this->pOut_ = (ostream *)0x0;
  }
  else {
    if (1 < *(int *)(*obj + 8)) {
      iVar1 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(*(ostream **)*obj,"  ",2);
        iVar1 = iVar1 + 1;
      } while (iVar1 < *(int *)(*obj + 8));
      if (1 < *(int *)(*obj + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>(*(ostream **)*obj," -- ",4);
      }
    }
    this->pOut_ = *(ostream **)*obj;
    StellaOutputProxy::operator<<((StellaOutputProxy *)this,in_RDX);
  }
  return (StellaOutputProxy)(ostream *)this;
}

Assistant:

StellaOutputProxy operator<<(const T& obj)
    {
        if (level_ > maxlevel_)
            return StellaOutputProxy();

        for (int l = 1; l < level_; ++l)
            (*pOut_) << "  ";

        if (level_ > 1) (*pOut_) << " -- ";

        StellaOutputProxy proxy;
        proxy.Init(*pOut_);
        proxy << obj;
        return proxy;
    }